

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

void Curl_cpool_multi_socket(Curl_multi *multi,curl_socket_t s,int ev_bitmask)

{
  undefined1 *puVar1;
  Curl_easy *data;
  Curl_share *pCVar2;
  CURLMcode CVar3;
  undefined8 in_RAX;
  Curl_llist_node *n;
  connectdata *conn;
  undefined8 uStack_38;
  _Bool done;
  
  data = (multi->cpool).idata;
  pCVar2 = (multi->cpool).share;
  uStack_38 = in_RAX;
  if ((pCVar2 != (Curl_share *)0x0) && ((pCVar2->specifier & 0x20) != 0)) {
    Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
  }
  puVar1 = &(multi->cpool).field_0x98;
  *puVar1 = *puVar1 | 1;
  n = Curl_llist_head(&(multi->cpool).shutdowns);
  do {
    if (n == (Curl_llist_node *)0x0) {
LAB_0011974d:
      puVar1 = &(multi->cpool).field_0x98;
      *puVar1 = *puVar1 & 0xfe;
      pCVar2 = (multi->cpool).share;
      if ((pCVar2 != (Curl_share *)0x0) && ((pCVar2->specifier & 0x20) != 0)) {
        Curl_share_unlock((multi->cpool).idata,CURL_LOCK_DATA_CONNECT);
        return;
      }
      return;
    }
    conn = (connectdata *)Curl_node_elem(n);
    if ((conn->sock[0] == s) || (conn->sock[1] == s)) {
      Curl_attach_connection(data,conn);
      cpool_run_conn_shutdown(data,conn,&done);
      Curl_detach_connection(data);
      if (done == false) {
        CVar3 = cpool_update_shutdown_ev(multi,data,conn);
        if (CVar3 == CURLM_OK) goto LAB_0011974d;
      }
      Curl_node_remove(n);
      cpool_close_and_destroy(&multi->cpool,conn,(Curl_easy *)0x0,false);
      goto LAB_0011974d;
    }
    n = Curl_node_next(n);
  } while( true );
}

Assistant:

void Curl_cpool_multi_socket(struct Curl_multi *multi,
                             curl_socket_t s, int ev_bitmask)
{
  struct cpool *cpool = &multi->cpool;
  struct Curl_easy *data = cpool->idata;
  struct Curl_llist_node *e;
  struct connectdata *conn;
  bool done;

  (void)ev_bitmask;
  DEBUGASSERT(multi->socket_cb);
  CPOOL_LOCK(cpool);
  e = Curl_llist_head(&cpool->shutdowns);
  while(e) {
    conn = Curl_node_elem(e);
    if(s == conn->sock[FIRSTSOCKET] || s == conn->sock[SECONDARYSOCKET]) {
      Curl_attach_connection(data, conn);
      cpool_run_conn_shutdown(data, conn, &done);
      DEBUGF(infof(data, "[CCACHE] shutdown #%" FMT_OFF_T ", done=%d",
                   conn->connection_id, done));
      Curl_detach_connection(data);
      if(done || cpool_update_shutdown_ev(multi, data, conn)) {
        Curl_node_remove(e);
        cpool_close_and_destroy(cpool, conn, NULL, FALSE);
      }
      break;
    }
    e = Curl_node_next(e);
  }
  CPOOL_UNLOCK(cpool);
}